

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

void __thiscall bitio::bitio_exception::bitio_exception(bitio_exception *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *msg_local;
  bitio_exception *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__bitio_exception_0010bd90;
  std::__cxx11::string::string((string *)&this->msg);
  std::operator+(&local_38,"bitio: ",msg);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->msg,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

bitio::bitio_exception::bitio_exception(std::string msg) {
    this->msg = "bitio: " + std::move(msg);
}